

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O0

bool __thiscall
dtc::fdt::checking::property_size_checker::check
          (property_size_checker *this,device_tree *param_1,node_ptr *param_2,property_ptr *p)

{
  bool bVar1;
  element_type *peVar2;
  pointer ppVar3;
  size_type sVar4;
  __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
  local_48;
  value_iterator e;
  value_iterator i;
  uint32_t psize;
  property_ptr *p_local;
  node_ptr *param_2_local;
  device_tree *param_1_local;
  property_size_checker *this_local;
  
  i._M_current._4_4_ = 0;
  peVar2 = std::__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)p);
  e = property::begin(peVar2);
  peVar2 = std::__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)p);
  local_48._M_current = (property_value *)property::end(peVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&e,&local_48);
    if (!bVar1) {
      return i._M_current._4_4_ == this->size;
    }
    ppVar3 = __gnu_cxx::
             __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
             ::operator->(&e);
    bVar1 = property_value::is_binary(ppVar3);
    if (!bVar1) break;
    ppVar3 = __gnu_cxx::
             __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
             ::operator->(&e);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&ppVar3->byte_data);
    i._M_current._4_4_ = i._M_current._4_4_ + (int)sVar4;
    __gnu_cxx::
    __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
    ::operator++(&e);
  }
  return false;
}

Assistant:

bool
property_size_checker::check(device_tree *, const node_ptr &, property_ptr p)
{
	uint32_t psize = 0;
	for (property::value_iterator i=p->begin(),e=p->end() ; i!=e ; ++i)
	{
		if (!i->is_binary())
		{
			return false;
		}
		psize += i->byte_data.size();
	}
	return psize == size;
}